

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sz_huffman.cpp
# Opt level: O2

void pad_tree_ushort(HuffmanTree *huffmanTree,unsigned_short *L,unsigned_short *R,uint *C,uchar *t,
                    uint i,node root)

{
  node root_00;
  uint uVar1;
  
  while( true ) {
    C[i] = root->c;
    t[i] = root->t;
    root_00 = root->left;
    if (root_00 != (node)0x0) {
      uVar1 = huffmanTree->n_inode + 1;
      huffmanTree->n_inode = uVar1;
      L[i] = (unsigned_short)uVar1;
      pad_tree_ushort(huffmanTree,L,R,C,t,uVar1,root_00);
    }
    root = root->right;
    if (root == (node_t *)0x0) break;
    uVar1 = huffmanTree->n_inode + 1;
    huffmanTree->n_inode = uVar1;
    R[i] = (unsigned_short)uVar1;
    i = uVar1;
  }
  return;
}

Assistant:

void pad_tree_ushort(HuffmanTree* huffmanTree, unsigned short* L, unsigned short* R, unsigned int* C, unsigned char* t, unsigned int i, node root)
{
	C[i] = root->c;
	t[i] = root->t;
	node lroot = root->left;
	if(lroot!=0)
	{
		huffmanTree->n_inode++;
		L[i] = huffmanTree->n_inode;
		pad_tree_ushort(huffmanTree,L,R,C,t,huffmanTree->n_inode, lroot);
	}
	node rroot = root->right;
	if(rroot!=0)
	{
		huffmanTree->n_inode++;
		R[i] = huffmanTree->n_inode;
		pad_tree_ushort(huffmanTree,L,R,C,t,huffmanTree->n_inode, rroot);
	}	
}